

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlutils.cpp
# Opt level: O0

XmlNamespaceMap * __thiscall
libcellml::traverseTreeForElementNamespaces_abi_cxx11_
          (XmlNamespaceMap *__return_storage_ptr__,libcellml *this,XmlNodePtr *node)

{
  bool bVar1;
  element_type *peVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar3;
  XmlNodePtr XVar4;
  shared_ptr<libcellml::XmlNode> local_f0;
  _Base_ptr local_e0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  shared_ptr<libcellml::XmlNode> local_d0;
  undefined1 local_c0 [8];
  XmlNamespaceMap subNodeNamespaceMap;
  string local_80;
  string local_60;
  undefined1 local_30 [8];
  XmlNodePtr tempNode;
  XmlNodePtr *node_local;
  XmlNamespaceMap *nodeNamespaceMap;
  
  tempNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  std::shared_ptr<libcellml::XmlNode>::shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)local_30,(shared_ptr<libcellml::XmlNode> *)this);
  while( true ) {
    bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)local_30,(nullptr_t)0x0);
    if (!bVar1) break;
    peVar2 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    bVar1 = XmlNode::isText(peVar2);
    if (!bVar1) {
      peVar2 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      bVar1 = XmlNode::isComment(peVar2);
      if (!bVar1) {
        peVar2 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        XmlNode::name_abi_cxx11_(&local_60,peVar2);
        peVar2 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        XmlNode::namespaceUri_abi_cxx11_(&local_80,peVar2);
        pVar3 = std::
                map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::emplace<std::__cxx11::string,std::__cxx11::string>
                          ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)__return_storage_ptr__,&local_60,&local_80);
        subNodeNamespaceMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)pVar3.first._M_node;
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
      }
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_30);
    XVar4 = XmlNode::firstChild((XmlNode *)&local_d0);
    traverseTreeForElementNamespaces_abi_cxx11_
              ((XmlNamespaceMap *)local_c0,(libcellml *)&local_d0,
               (XmlNodePtr *)
               XVar4.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_d0);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c0);
    local_e0 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_c0);
    std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::insert<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)__return_storage_ptr__,local_d8,
               (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )local_e0);
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_30);
    XmlNode::next((XmlNode *)&local_f0);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)local_30,&local_f0);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_f0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_c0);
  }
  tempNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 1;
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)local_30);
  if ((tempNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._7_1_ & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

XmlNamespaceMap traverseTreeForElementNamespaces(const XmlNodePtr &node)
{
    XmlNamespaceMap nodeNamespaceMap;
    auto tempNode = node;
    while (tempNode != nullptr) {
        if (!tempNode->isText() && !tempNode->isComment()) {
            nodeNamespaceMap.emplace(tempNode->name(), tempNode->namespaceUri());
        }

        auto subNodeNamespaceMap = traverseTreeForElementNamespaces(tempNode->firstChild());

        nodeNamespaceMap.insert(subNodeNamespaceMap.begin(), subNodeNamespaceMap.end());

        tempNode = tempNode->next();
    }

    return nodeNamespaceMap;
}